

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::ForceManager::setupCutoffs(ForceManager *this)

{
  bool bVar1;
  undefined1 uVar2;
  double *pdVar3;
  mapped_type *pmVar4;
  pointer ppVar5;
  void *pvVar6;
  pointer ppVar7;
  undefined8 uVar8;
  int __x;
  long in_RDI;
  double extraout_XMM0_Qa;
  RealType RVar9;
  string funcType;
  string theMeth;
  const_iterator it;
  string myMethod;
  iterator i_1;
  string cutMeth;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
  stringToCutoffMethod;
  RealType thisCut;
  AtomTypeSet atomTypes_;
  iterator i;
  int mdFileVersion;
  Globals *simParams_;
  Globals *in_stack_fffffffffffffbb8;
  InteractionManager *in_stack_fffffffffffffbc0;
  SwitchingFunctionType in_stack_fffffffffffffbcc;
  SwitchingFunction *in_stack_fffffffffffffbd0;
  undefined7 in_stack_fffffffffffffbd8;
  undefined1 in_stack_fffffffffffffbdf;
  errorStruct *in_stack_fffffffffffffbe0;
  locale *in_stack_fffffffffffffbf0;
  errorStruct *peVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0f;
  InteractionManager *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4c;
  undefined1 in_stack_fffffffffffffc4d;
  undefined1 in_stack_fffffffffffffc4e;
  undefined1 in_stack_fffffffffffffc4f;
  locale *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  errorStruct *in_stack_fffffffffffffc60;
  undefined1 local_2c0 [40];
  iterator local_298;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
  local_290;
  iterator local_288;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
  local_280;
  string local_278 [32];
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
  local_258;
  locale local_250 [8];
  string local_248 [32];
  _Self local_228;
  _Base_ptr local_220;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
  local_218;
  locale local_210 [8];
  string local_208 [32];
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [80];
  _Self local_a8;
  _Base_ptr local_a0;
  RealType local_98 [15];
  _Rb_tree_const_iterator<OpenMD::AtomType_*> local_20;
  int local_14;
  Globals *local_10;
  
  local_10 = SimInfo::getSimParams(*(SimInfo **)(in_RDI + 0x18));
  *(undefined8 *)(in_RDI + 0x50) = 0;
  bVar1 = Globals::haveMDfileVersion((Globals *)0x146c00);
  if (bVar1) {
    local_14 = Globals::getMDfileVersion((Globals *)0x146c13);
  }
  else {
    local_14 = 0;
  }
  std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::_Rb_tree_const_iterator(&local_20);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x146c41);
  SimInfo::getSimulatedAtomTypes
            ((SimInfo *)
             CONCAT17(in_stack_fffffffffffffc4f,
                      CONCAT16(in_stack_fffffffffffffc4e,
                               CONCAT15(in_stack_fffffffffffffc4d,
                                        CONCAT14(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48
                                                )))));
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
  operator=((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_> *
            )in_stack_fffffffffffffbc0,
            (set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_> *
            )in_stack_fffffffffffffbb8);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::~set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x146c86);
  bVar1 = Globals::haveCutoffRadius((Globals *)0x146c93);
  if (bVar1) {
    RVar9 = Globals::getCutoffRadius((Globals *)0x146cb6);
    *(RealType *)(in_RDI + 0x50) = RVar9;
  }
  else {
    bVar1 = SimInfo::usesElectrostaticAtoms(*(SimInfo **)(in_RDI + 0x18));
    if (bVar1) {
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs: No value was set for the cutoffRadius.\n\tOpenMD will use a default value of 12.0 angstroms for the cutoffRadius.\n"
              );
      painCave.isFatal = 0;
      painCave.severity = 3;
      simError();
      *(undefined8 *)(in_RDI + 0x50) = 0x4028000000000000;
    }
    else {
      local_a0 = (_Base_ptr)
                 std::
                 set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                 ::begin((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                          *)in_stack_fffffffffffffbb8);
      local_20._M_node = local_a0;
      while( true ) {
        local_a8._M_node =
             (_Base_ptr)
             std::
             set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
             end((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
                  *)in_stack_fffffffffffffbb8);
        bVar1 = std::operator!=(&local_20,&local_a8);
        if (!bVar1) break;
        std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
                  ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)in_stack_fffffffffffffbc0);
        local_98[0] = InteractionManager::getSuggestedCutoffRadius
                                (in_stack_fffffffffffffc10,
                                 (AtomType *)
                                 CONCAT17(in_stack_fffffffffffffc0f,in_stack_fffffffffffffc08));
        pdVar3 = std::max<double>(local_98,(double *)(in_RDI + 0x50));
        *(double *)(in_RDI + 0x50) = *pdVar3;
        std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator++
                  ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)in_stack_fffffffffffffbc0);
      }
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs: No value was set for the cutoffRadius.\n\tOpenMD will use %lf angstroms.\n"
               ,*(undefined8 *)(in_RDI + 0x50));
      painCave.isFatal = 0;
      painCave.severity = 3;
      simError();
    }
  }
  ForceDecomposition::setCutoffRadius
            (*(ForceDecomposition **)(in_RDI + 0x30),*(RealType *)(in_RDI + 0x50));
  InteractionManager::setCutoffRadius(in_stack_fffffffffffffbc0,(RealType)in_stack_fffffffffffffbb8)
  ;
  *(double *)(in_RDI + 0x58) = *(double *)(in_RDI + 0x50) * *(double *)(in_RDI + 0x50);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
         *)0x146f18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
             (allocator<char> *)in_stack_fffffffffffffbf0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                         *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  *pmVar4 = HARD;
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
             (allocator<char> *)in_stack_fffffffffffffbf0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                         *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  *pmVar4 = SWITCHED;
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
             (allocator<char> *)in_stack_fffffffffffffbf0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                         *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  *pmVar4 = SHIFTED_POTENTIAL;
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
             (allocator<char> *)in_stack_fffffffffffffbf0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                         *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  *pmVar4 = SHIFTED_FORCE;
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
             (allocator<char> *)in_stack_fffffffffffffbf0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                         *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  *pmVar4 = TAYLOR_SHIFTED;
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8,
             (allocator<char> *)in_stack_fffffffffffffbf0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                         *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  *pmVar4 = EWALD_FULL;
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  bVar1 = Globals::haveCutoffMethod((Globals *)0x147201);
  if (bVar1) {
    Globals::getCutoffMethod_abi_cxx11_(in_stack_fffffffffffffbb8);
    std::locale::locale(local_210);
    toUpperCopy<std::__cxx11::string>(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    std::locale::~locale(local_210);
    std::__cxx11::string::~string(local_208);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
    ::_Rb_tree_iterator(&local_218);
    local_220 = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                        *)in_stack_fffffffffffffbb8,(key_type *)0x1472a1);
    local_218._M_node = local_220;
    local_228._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                *)in_stack_fffffffffffffbb8);
    bVar1 = std::operator==(&local_218,&local_228);
    if (bVar1) {
      uVar8 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs: Could not find chosen cutoffMethod %s\n\tShould be one of: HARD, SWITCHED, SHIFTED_POTENTIAL, TAYLOR_SHIFTED,\n\tSHIFTED_FORCE, or EWALD_FULL\n"
               ,uVar8);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
                             *)0x14758d);
      *(CutoffMethod *)(in_RDI + 0x68) = ppVar5->second;
    }
    std::__cxx11::string::~string(local_1e8);
    goto LAB_00147a78;
  }
  if (1 < local_14) {
    snprintf(painCave.errMsg,2000,
             "ForceManager::setupCutoffs: No value was set for the cutoffMethod.\n\tOpenMD will use SHIFTED_FORCE.\n"
            );
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
    *(undefined4 *)(in_RDI + 0x68) = 3;
    goto LAB_00147a78;
  }
  in_stack_fffffffffffffc60 = &painCave;
  snprintf(painCave.errMsg,2000,
           "ForceManager::setupCutoffs : DEPRECATED FILE FORMAT!\n\tOpenMD found a file which does not set a cutoffMethod.\n\tOpenMD will attempt to deduce a cutoffMethod using the\n\tbehavior of the older (version 1) code.  To remove this\n\twarning, add an explicit cutoffMethod and change the top\n\tof the file so that it begins with <OpenMD version=2>\n"
          );
  in_stack_fffffffffffffc60->isFatal = 0;
  in_stack_fffffffffffffc60->severity = 2;
  simError();
  in_stack_fffffffffffffc5f = Globals::haveElectrostaticSummationMethod((Globals *)0x147665);
  if (!(bool)in_stack_fffffffffffffc5f) goto LAB_00147a78;
  Globals::getElectrostaticSummationMethod_abi_cxx11_(in_stack_fffffffffffffbb8);
  in_stack_fffffffffffffc50 = local_250;
  std::locale::locale(in_stack_fffffffffffffc50);
  toUpper<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbe0,
             (locale *)CONCAT17(in_stack_fffffffffffffbdf,in_stack_fffffffffffffbd8));
  std::locale::~locale(local_250);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
  if (bVar1) {
    *(undefined4 *)(in_RDI + 0x68) = 2;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
    if (bVar1) {
      *(undefined4 *)(in_RDI + 0x68) = 3;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
      if (bVar1) {
        *(undefined4 *)(in_RDI + 0x68) = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
        if (bVar1) {
          *(undefined4 *)(in_RDI + 0x68) = 5;
          *(undefined1 *)(in_RDI + 0xf) = 1;
        }
      }
    }
  }
  bVar1 = Globals::haveSwitchingRadius((Globals *)0x147811);
  if (bVar1) {
    RVar9 = Globals::getSwitchingRadius((Globals *)0x147834);
    *(RealType *)(in_RDI + 0x60) = RVar9;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
  if (((bVar1) ||
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8), bVar1))
     || (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8),
        bVar1)) {
LAB_00147901:
    __x = (int)local_10;
    bVar1 = Globals::haveSwitchingRadius((Globals *)0x14790e);
    if (bVar1) {
      uVar8 = std::__cxx11::string::c_str();
      __x = 0x515674;
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs : DEPRECATED ERROR MESSAGE\n\tA value was set for the switchingRadius\n\teven though the electrostaticSummationMethod was\n\tset to %s\n"
               ,uVar8);
      painCave.severity = 2;
      painCave.isFatal = 1;
      simError();
    }
  }
  else {
    __x = (int)local_248;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
    if (bVar1) goto LAB_00147901;
  }
  std::abs(__x);
  if (extraout_XMM0_Qa < 0.0001) {
    if (*(int *)(in_RDI + 0x68) == 3) {
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs : DEPRECATED BEHAVIOR\n\tcutoffRadius and switchingRadius are set to the\n\tsame value.  OpenMD will use shifted force\n\tpotentials instead of switching functions.\n"
              );
      painCave.isFatal = 0;
      painCave.severity = 2;
      simError();
    }
    else {
      *(undefined4 *)(in_RDI + 0x68) = 2;
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs : DEPRECATED BEHAVIOR\n\tcutoffRadius and switchingRadius are set to the\n\tsame value.  OpenMD will use shifted potentials\n\tinstead of switching functions.\n"
              );
      painCave.isFatal = 0;
      painCave.severity = 2;
      simError();
    }
  }
  std::__cxx11::string::~string(local_248);
LAB_00147a78:
  pvVar6 = operator_new(0x40);
  SwitchingFunction::SwitchingFunction((SwitchingFunction *)in_stack_fffffffffffffbe0);
  *(void **)(in_RDI + 0x38) = pvVar6;
  if (*(int *)(in_RDI + 0x68) == 1) {
    bVar1 = Globals::haveSwitchingRadius((Globals *)0x147abd);
    if (bVar1) {
      RVar9 = Globals::getSwitchingRadius((Globals *)0x147add);
      *(RealType *)(in_RDI + 0x60) = RVar9;
      if (*(double *)(in_RDI + 0x50) <= *(double *)(in_RDI + 0x60) &&
          *(double *)(in_RDI + 0x60) != *(double *)(in_RDI + 0x50)) {
        peVar10 = &painCave;
        snprintf(painCave.errMsg,2000,
                 "ForceManager::setupCutoffs: switchingRadius (%f) is larger than the cutoffRadius(%f)\n"
                 ,*(undefined8 *)(in_RDI + 0x60),*(undefined8 *)(in_RDI + 0x50));
        peVar10->isFatal = 1;
        peVar10->severity = 1;
        simError();
      }
    }
    else {
      *(double *)(in_RDI + 0x60) = *(double *)(in_RDI + 0x50) * 0.85;
      peVar10 = &painCave;
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs: No value was set for the switchingRadius.\n\tOpenMD will use a default value of 85 percent of the cutoffRadius.\n\tswitchingRadius = %f. for this simulation\n"
               ,*(undefined8 *)(in_RDI + 0x60));
      peVar10->isFatal = 0;
      peVar10->severity = 2;
      simError();
    }
  }
  else {
    if ((1 < local_14) && (bVar1 = Globals::haveSwitchingRadius((Globals *)0x147c05), bVar1)) {
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
      ::_Rb_tree_const_iterator(&local_258);
      std::__cxx11::string::string(local_278);
      local_288._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                    *)in_stack_fffffffffffffbb8);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
      ::_Rb_tree_const_iterator(&local_280,&local_288);
      local_258._M_node = local_280._M_node;
      while( true ) {
        local_298._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
                    *)in_stack_fffffffffffffbb8);
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
        ::_Rb_tree_const_iterator(&local_290,&local_298);
        bVar1 = std::operator!=(&local_258,&local_290);
        if (!bVar1) break;
        ppVar7 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
                 ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
                               *)0x147cbe);
        if (ppVar7->second == *(CutoffMethod *)(in_RDI + 0x68)) {
          ppVar7 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
                   ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
                                 *)0x147cdb);
          std::__cxx11::string::operator=(local_278,(string *)ppVar7);
          break;
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
        ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>
                      *)in_stack_fffffffffffffbc0);
      }
      uVar8 = std::__cxx11::string::c_str();
      in_stack_fffffffffffffbe0 = &painCave;
      snprintf(painCave.errMsg,2000,
               "ForceManager::setupCutoffs: the cutoffMethod (%s)\n\tis not set to SWITCHED, so switchingRadius value\n\twill be ignored for this simulation\n"
               ,uVar8);
      *(undefined4 *)((long)in_stack_fffffffffffffbe0->errMsg + 2000) = 0;
      *(undefined4 *)((long)in_stack_fffffffffffffbe0->errMsg + 0x7d4) = 2;
      simError();
      std::__cxx11::string::~string(local_278);
    }
    *(undefined8 *)(in_RDI + 0x60) = *(undefined8 *)(in_RDI + 0x50);
  }
  *(undefined4 *)(in_RDI + 0x48) = 0;
  uVar2 = Globals::haveSwitchingFunctionType((Globals *)0x147db5);
  if ((bool)uVar2) {
    Globals::getSwitchingFunctionType_abi_cxx11_(in_stack_fffffffffffffbb8);
    in_stack_fffffffffffffbd0 = (SwitchingFunction *)local_2c0;
    std::locale::locale((locale *)in_stack_fffffffffffffbd0);
    toUpper<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbe0,(locale *)CONCAT17(uVar2,in_stack_fffffffffffffbd8));
    std::locale::~locale((locale *)local_2c0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
    in_stack_fffffffffffffbcc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbcc);
    if (bVar1) {
      *(undefined4 *)(in_RDI + 0x48) = 0;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
      in_stack_fffffffffffffbcc =
           CONCAT13((char)(in_stack_fffffffffffffbcc >> 0x18),
                    CONCAT12(bVar1,(short)in_stack_fffffffffffffbcc));
      if (bVar1) {
        *(undefined4 *)(in_RDI + 0x48) = 1;
      }
      else {
        uVar8 = std::__cxx11::string::c_str();
        peVar10 = &painCave;
        snprintf(painCave.errMsg,2000,
                 "ForceManager::setupSwitching : Unknown switchingFunctionType. (Input file specified %s .)\n\tswitchingFunctionType must be one of: \"cubic\" or \"fifth_order_polynomial\"."
                 ,uVar8);
        peVar10->isFatal = 1;
        peVar10->severity = 1;
        simError();
      }
    }
    std::__cxx11::string::~string((string *)(local_2c0 + 8));
  }
  SwitchingFunction::setSwitchType(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbcc);
  SwitchingFunction::setSwitch
            ((SwitchingFunction *)in_stack_fffffffffffffc60,
             (RealType)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
             (RealType)in_stack_fffffffffffffc50);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::CutoffMethod>_>_>
          *)0x147f6f);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::~set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x147f7c);
  return;
}

Assistant:

void ForceManager::setupCutoffs() {
    Globals* simParams_ = info_->getSimParams();
    int mdFileVersion;
    rCut_ = 0.0;  // Needs a value for a later max() call;

    if (simParams_->haveMDfileVersion())
      mdFileVersion = simParams_->getMDfileVersion();
    else
      mdFileVersion = 0;

    // We need the list of simulated atom types to figure out cutoffs
    // as well as long range corrections.

    AtomTypeSet::iterator i;
    AtomTypeSet atomTypes_;
    atomTypes_ = info_->getSimulatedAtomTypes();

    if (simParams_->haveCutoffRadius()) {
      rCut_ = simParams_->getCutoffRadius();
    } else {
      if (info_->usesElectrostaticAtoms()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: No value was set for the "
                 "cutoffRadius.\n"
                 "\tOpenMD will use a default value of 12.0 angstroms "
                 "for the cutoffRadius.\n");
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
        rCut_ = 12.0;
      } else {
        RealType thisCut;
        for (i = atomTypes_.begin(); i != atomTypes_.end(); ++i) {
          thisCut = interactionMan_->getSuggestedCutoffRadius((*i));
          rCut_   = max(thisCut, rCut_);
        }
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: No value was set for the "
                 "cutoffRadius.\n"
                 "\tOpenMD will use %lf angstroms.\n",
                 rCut_);
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
      }
    }

    fDecomp_->setCutoffRadius(rCut_);
    interactionMan_->setCutoffRadius(rCut_);
    rCutSq_ = rCut_ * rCut_;

    map<string, CutoffMethod> stringToCutoffMethod;
    stringToCutoffMethod["HARD"]              = HARD;
    stringToCutoffMethod["SWITCHED"]          = SWITCHED;
    stringToCutoffMethod["SHIFTED_POTENTIAL"] = SHIFTED_POTENTIAL;
    stringToCutoffMethod["SHIFTED_FORCE"]     = SHIFTED_FORCE;
    stringToCutoffMethod["TAYLOR_SHIFTED"]    = TAYLOR_SHIFTED;
    stringToCutoffMethod["EWALD_FULL"]        = EWALD_FULL;

    if (simParams_->haveCutoffMethod()) {
      string cutMeth = toUpperCopy(simParams_->getCutoffMethod());
      map<string, CutoffMethod>::iterator i;
      i = stringToCutoffMethod.find(cutMeth);
      if (i == stringToCutoffMethod.end()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: Could not find chosen "
                 "cutoffMethod %s\n"
                 "\tShould be one of: "
                 "HARD, SWITCHED, SHIFTED_POTENTIAL, TAYLOR_SHIFTED,\n"
                 "\tSHIFTED_FORCE, or EWALD_FULL\n",
                 cutMeth.c_str());
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
      } else {
        cutoffMethod_ = i->second;
      }
    } else {
      if (mdFileVersion > 1) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: No value was set "
                 "for the cutoffMethod.\n"
                 "\tOpenMD will use SHIFTED_FORCE.\n");
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_INFO;
        simError();
        cutoffMethod_ = SHIFTED_FORCE;
      } else {
        // handle the case where the old file version was in play
        // (there should be no cutoffMethod, so we have to deduce it
        // from other data).

        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs : DEPRECATED FILE FORMAT!\n"
                 "\tOpenMD found a file which does not set a cutoffMethod.\n"
                 "\tOpenMD will attempt to deduce a cutoffMethod using the\n"
                 "\tbehavior of the older (version 1) code.  To remove this\n"
                 "\twarning, add an explicit cutoffMethod and change the top\n"
                 "\tof the file so that it begins with <OpenMD version=2>\n");
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();

        // The old file version tethered the shifting behavior to the
        // electrostaticSummationMethod keyword.

        if (simParams_->haveElectrostaticSummationMethod()) {
          string myMethod = simParams_->getElectrostaticSummationMethod();
          toUpper(myMethod);

          if (myMethod == "SHIFTED_POTENTIAL") {
            cutoffMethod_ = SHIFTED_POTENTIAL;
          } else if (myMethod == "SHIFTED_FORCE") {
            cutoffMethod_ = SHIFTED_FORCE;
          } else if (myMethod == "TAYLOR_SHIFTED") {
            cutoffMethod_ = TAYLOR_SHIFTED;
          } else if (myMethod == "EWALD_FULL") {
            cutoffMethod_   = EWALD_FULL;
            useSurfaceTerm_ = true;
          }

          if (simParams_->haveSwitchingRadius())
            rSwitch_ = simParams_->getSwitchingRadius();

          if (myMethod == "SHIFTED_POTENTIAL" || myMethod == "SHIFTED_FORCE" ||
              myMethod == "TAYLOR_SHIFTED" || myMethod == "EWALD_FULL") {
            if (simParams_->haveSwitchingRadius()) {
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "ForceManager::setupCutoffs : DEPRECATED ERROR MESSAGE\n"
                       "\tA value was set for the switchingRadius\n"
                       "\teven though the electrostaticSummationMethod was\n"
                       "\tset to %s\n",
                       myMethod.c_str());
              painCave.severity = OPENMD_WARNING;
              painCave.isFatal  = 1;
              simError();
            }
          }
          if (abs(rCut_ - rSwitch_) < 0.0001) {
            if (cutoffMethod_ == SHIFTED_FORCE) {
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "ForceManager::setupCutoffs : DEPRECATED BEHAVIOR\n"
                       "\tcutoffRadius and switchingRadius are set to the\n"
                       "\tsame value.  OpenMD will use shifted force\n"
                       "\tpotentials instead of switching functions.\n");
              painCave.isFatal  = 0;
              painCave.severity = OPENMD_WARNING;
              simError();
            } else {
              cutoffMethod_ = SHIFTED_POTENTIAL;
              snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                       "ForceManager::setupCutoffs : DEPRECATED BEHAVIOR\n"
                       "\tcutoffRadius and switchingRadius are set to the\n"
                       "\tsame value.  OpenMD will use shifted potentials\n"
                       "\tinstead of switching functions.\n");
              painCave.isFatal  = 0;
              painCave.severity = OPENMD_WARNING;
              simError();
            }
          }
        }
      }
    }

    // create the switching function object:

    switcher_ = new SwitchingFunction();

    if (cutoffMethod_ == SWITCHED) {
      if (simParams_->haveSwitchingRadius()) {
        rSwitch_ = simParams_->getSwitchingRadius();
        if (rSwitch_ > rCut_) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "ForceManager::setupCutoffs: switchingRadius (%f) is larger "
                   "than the cutoffRadius(%f)\n",
                   rSwitch_, rCut_);
          painCave.isFatal  = 1;
          painCave.severity = OPENMD_ERROR;
          simError();
        }
      } else {
        rSwitch_ = 0.85 * rCut_;
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ForceManager::setupCutoffs: No value was set for the "
                 "switchingRadius.\n"
                 "\tOpenMD will use a default value of 85 percent of the "
                 "cutoffRadius.\n"
                 "\tswitchingRadius = %f. for this simulation\n",
                 rSwitch_);
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
      }
    } else {
      if (mdFileVersion > 1) {
        // throw an error if we define a switching radius and don't need one.
        // older file versions should not do this.
        if (simParams_->haveSwitchingRadius()) {
          map<string, CutoffMethod>::const_iterator it;
          string theMeth;
          for (it = stringToCutoffMethod.begin();
               it != stringToCutoffMethod.end(); ++it) {
            if (it->second == cutoffMethod_) {
              theMeth = it->first;
              break;
            }
          }
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "ForceManager::setupCutoffs: the cutoffMethod (%s)\n"
                   "\tis not set to SWITCHED, so switchingRadius value\n"
                   "\twill be ignored for this simulation\n",
                   theMeth.c_str());
          painCave.isFatal  = 0;
          painCave.severity = OPENMD_WARNING;
          simError();
        }
      }
      rSwitch_ = rCut_;
    }

    // Default to cubic switching function.
    sft_ = cubic;
    if (simParams_->haveSwitchingFunctionType()) {
      string funcType = simParams_->getSwitchingFunctionType();
      toUpper(funcType);
      if (funcType == "CUBIC") {
        sft_ = cubic;
      } else {
        if (funcType == "FIFTH_ORDER_POLYNOMIAL") {
          sft_ = fifth_order_poly;
        } else {
          // throw error
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "ForceManager::setupSwitching : Unknown switchingFunctionType. "
              "(Input "
              "file specified %s .)\n"
              "\tswitchingFunctionType must be one of: "
              "\"cubic\" or \"fifth_order_polynomial\".",
              funcType.c_str());
          painCave.isFatal  = 1;
          painCave.severity = OPENMD_ERROR;
          simError();
        }
      }
    }
    switcher_->setSwitchType(sft_);
    switcher_->setSwitch(rSwitch_, rCut_);
  }